

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllocatorList.h
# Opt level: O0

void __thiscall
llvm::
AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
::~AllocatorList(AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
                 *this)

{
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  *this_local;
  
  clear(this);
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl
            (&this->super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>);
  return;
}

Assistant:

~AllocatorList() { clear(); }